

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

Hospital * __thiscall Hospital::Getter_Password_abi_cxx11_(Hospital *this)

{
  long in_RSI;
  Hospital *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x20));
  return this;
}

Assistant:

string Hospital ::Getter_Password(){
    return Admin_Password;
}